

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_sse2.c
# Opt level: O3

void av1_apply_temporal_filter_sse2
               (YV12_BUFFER_CONFIG *frame_to_filter,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
               int mb_row,int mb_col,int num_planes,double *noise_levels,MV *subblock_mvs,
               int *subblock_mses,int q_factor,int filter_strength,int tf_wgt_calc_lvl,uint8_t *pred
               ,uint32_t *accum,uint16_t *count)

{
  byte *pbVar1;
  undefined8 uVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  byte bVar18;
  byte bVar19;
  byte bVar20;
  undefined1 auVar21 [14];
  undefined1 auVar22 [15];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [15];
  undefined1 auVar26 [14];
  undefined1 auVar27 [15];
  undefined1 auVar28 [14];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  ushort uVar32;
  byte bVar33;
  byte bVar34;
  byte bVar35;
  byte bVar36;
  byte bVar37;
  byte bVar38;
  byte bVar39;
  byte bVar40;
  byte bVar41;
  byte bVar42;
  byte bVar43;
  byte bVar44;
  byte bVar45;
  byte bVar46;
  byte bVar47;
  byte bVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined1 auVar51 [15];
  unkuint9 Var52;
  undefined1 auVar53 [11];
  undefined1 auVar54 [13];
  undefined1 auVar55 [14];
  undefined1 auVar56 [14];
  byte bVar57;
  byte bVar58;
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  uint uVar61;
  uint uVar62;
  uint uVar63;
  ulong uVar66;
  int iVar67;
  uint uVar68;
  undefined7 in_register_00000011;
  uint8_t *puVar69;
  uint8_t *puVar70;
  int iVar71;
  ushort *puVar72;
  undefined1 *puVar73;
  int *piVar74;
  undefined1 (*pauVar75) [16];
  ulong uVar76;
  long lVar77;
  undefined1 *puVar78;
  int iVar79;
  uint uVar80;
  int iVar81;
  uint8_t *puVar82;
  int iVar83;
  long lVar84;
  ulong uVar85;
  ulong uVar86;
  double dVar87;
  double dVar88;
  undefined1 auVar89 [16];
  undefined1 auVar93 [14];
  uint uVar90;
  double dVar91;
  double dVar92;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  uint uVar99;
  double dVar100;
  uint uVar103;
  uint uVar104;
  double dVar105;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  uint uVar106;
  undefined1 auVar107 [14];
  double dVar111;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  double dVar112;
  double d_factor [4];
  double d_factor_decayed [4];
  double subblock_mses_scaled [4];
  uint16_t frame_sse [1152];
  uint32_t luma_sse_sum [1024];
  uint32_t acc_5x5_sse [32] [32];
  ulong local_2b10;
  int local_2afc;
  double local_2aa8;
  double local_2a38 [2];
  int local_2a28 [4];
  undefined8 local_2a18;
  undefined8 uStack_2a10;
  undefined8 local_2a08;
  undefined8 uStack_2a00;
  undefined8 local_29f8 [8];
  undefined1 local_29b8 [16];
  undefined1 local_29a8 [16];
  undefined1 local_2998 [16];
  undefined1 local_2988 [16];
  double adStack_2978 [4];
  double adStack_2958 [4];
  ushort local_2938 [1152];
  int local_2038 [1024];
  undefined1 local_1038 [4104];
  ulong uVar64;
  ulong uVar65;
  undefined1 auVar96 [16];
  short sVar97;
  undefined2 uVar98;
  
  uVar66 = CONCAT71(in_register_00000011,block_size) & 0xffffffff;
  bVar3 = block_size_high[uVar66];
  bVar4 = block_size_wide[uVar66];
  iVar81 = (frame_to_filter->field_2).field_0.y_crop_width;
  dVar112 = (double)q_factor / 20.0;
  iVar67 = (frame_to_filter->field_3).field_0.y_crop_height;
  dVar112 = dVar112 * dVar112;
  dVar92 = 1.0;
  if (dVar112 <= 1.0) {
    dVar92 = dVar112;
  }
  dVar100 = (double)q_factor * 0.015625;
  dVar87 = (double)filter_strength * 0.25 * (double)filter_strength * 0.25;
  dVar91 = 1.0;
  if (dVar87 <= 1.0) {
    dVar91 = dVar87;
  }
  local_2a28[0] = 0;
  local_2a28[1] = 0;
  local_2a28[2] = 0;
  local_2a28[3] = 0;
  local_2a38[0] = 0.0;
  local_2a38[1] = 0.0;
  lVar84 = 0;
  memset(local_2938,0,0x900);
  memset(local_2038,0,0x1000);
  if (iVar67 < iVar81) {
    iVar81 = iVar67;
  }
  dVar88 = (double)iVar81 * 0.1;
  if (dVar88 <= 1.0) {
    dVar88 = 1.0;
  }
  auVar109._8_8_ = dVar88;
  auVar109._0_8_ = dVar88;
  do {
    uVar2 = *(undefined8 *)(subblock_mvs + lVar84);
    dVar111 = (double)(int)(short)((ulong)uVar2 >> 0x20);
    dVar88 = (double)((int)uVar2 >> 0x10);
    dVar105 = (double)(int)((long)uVar2 >> 0x30);
    auVar101._0_8_ = dVar88 * dVar88 + (double)(int)(short)uVar2 * (double)(int)(short)uVar2;
    auVar101._8_8_ = dVar105 * dVar105 + dVar111 * dVar111;
    auVar101 = sqrtpd(auVar101,auVar101);
    auVar101 = divpd(auVar101,auVar109);
    auVar101 = maxpd(auVar101,_DAT_004d1310);
    *(undefined1 (*) [16])(local_2a38 + lVar84) = auVar101;
    lVar84 = lVar84 + 2;
  } while (lVar84 != 4);
  local_2aa8 = dVar100 * dVar100 * 0.5;
  if (q_factor < 0x80) {
    local_2aa8 = (double)(-(ulong)(dVar112 < 1e-05) & 0x3ee4f8b588e368f1 |
                         ~-(ulong)(dVar112 < 1e-05) & (ulong)dVar92);
  }
  if (0 < num_planes) {
    uVar66 = 0;
    local_2afc = 0;
    do {
      iVar81 = mbd->plane[uVar66].subsampling_x;
      iVar67 = mbd->plane[uVar66].subsampling_y;
      bVar57 = bVar3 >> ((byte)iVar67 & 0x1f);
      uVar61 = (uint)bVar57;
      uVar64 = (ulong)uVar61;
      bVar58 = bVar4 >> ((byte)iVar81 & 0x1f);
      uVar62 = (uint)bVar58;
      uVar65 = (ulong)uVar62;
      iVar81 = iVar81 - mbd->plane[0].subsampling_x;
      iVar67 = iVar67 - mbd->plane[0].subsampling_y;
      bVar5 = (byte)iVar67;
      bVar6 = (byte)iVar81;
      dVar92 = 0.04;
      if (uVar66 != 0) {
        dVar92 = 1.0 / (double)((1 << (bVar5 + bVar6 & 0x1f)) + 0x19);
      }
      uVar90 = *(uint *)((long)frame_to_filter->store_buf_adr + (ulong)(uVar66 != 0) * 4 + -0x28);
      puVar70 = frame_to_filter->store_buf_adr[uVar66 - 4] +
                (int)(uVar62 * mb_col + uVar90 * uVar61 * mb_row);
      dVar112 = log(noise_levels[uVar66] + noise_levels[uVar66] + 5.0);
      if ((uVar66 == 1) && (uVar61 != 0)) {
        uVar63 = 1 << (bVar5 & 0x1f);
        uVar68 = 1 << (bVar6 & 0x1f);
        if ((int)uVar68 < 2) {
          uVar68 = 1;
        }
        if ((int)uVar63 < 2) {
          uVar63 = 1;
        }
        local_2b10 = 0;
        do {
          if (uVar62 != 0) {
            uVar76 = 0;
            do {
              if (iVar67 != 0x1f) {
                iVar79 = ((int)uVar76 << (bVar6 & 0x1f)) +
                         ((int)local_2b10 << (bVar5 & 0x1f)) * 0x24 + 2;
                lVar84 = uVar76 + local_2b10 * 0x20;
                uVar80 = 0;
                do {
                  if (iVar81 != 0x1f) {
                    iVar83 = local_2038[lVar84];
                    uVar85 = (ulong)uVar68;
                    iVar71 = iVar79;
                    do {
                      iVar83 = iVar83 + (uint)local_2938[iVar71];
                      iVar71 = iVar71 + 1;
                      uVar85 = uVar85 - 1;
                    } while (uVar85 != 0);
                    local_2038[lVar84] = iVar83;
                  }
                  uVar80 = uVar80 + 1;
                  iVar79 = iVar79 + 0x24;
                } while (uVar80 != uVar63);
              }
              uVar76 = uVar76 + 1;
            } while (uVar76 != uVar65);
          }
          local_2b10 = local_2b10 + 1;
        } while (local_2b10 != uVar64);
      }
      lVar84 = (long)local_2afc;
      puVar82 = pred + lVar84;
      if (uVar61 != 0) {
        uVar68 = 0;
        puVar72 = local_2938;
        puVar69 = puVar82;
        do {
          if (uVar62 != 0) {
            uVar76 = 0;
            do {
              pbVar1 = puVar70 + uVar76;
              bVar33 = *pbVar1;
              bVar34 = pbVar1[1];
              bVar35 = pbVar1[2];
              bVar36 = pbVar1[3];
              bVar37 = pbVar1[4];
              bVar38 = pbVar1[5];
              bVar39 = pbVar1[6];
              bVar40 = pbVar1[7];
              bVar41 = pbVar1[8];
              bVar42 = pbVar1[9];
              bVar43 = pbVar1[10];
              bVar44 = pbVar1[0xb];
              bVar45 = pbVar1[0xc];
              bVar46 = pbVar1[0xd];
              bVar47 = pbVar1[0xe];
              bVar48 = pbVar1[0xf];
              auVar109 = *(undefined1 (*) [16])(puVar69 + uVar76);
              bVar5 = auVar109[0];
              auVar108[0] = (bVar33 < bVar5) * bVar5 | (bVar33 >= bVar5) * bVar33;
              bVar6 = auVar109[1];
              auVar108[1] = (bVar34 < bVar6) * bVar6 | (bVar34 >= bVar6) * bVar34;
              bVar7 = auVar109[2];
              auVar108[2] = (bVar35 < bVar7) * bVar7 | (bVar35 >= bVar7) * bVar35;
              bVar8 = auVar109[3];
              auVar108[3] = (bVar36 < bVar8) * bVar8 | (bVar36 >= bVar8) * bVar36;
              bVar9 = auVar109[4];
              auVar108[4] = (bVar37 < bVar9) * bVar9 | (bVar37 >= bVar9) * bVar37;
              bVar10 = auVar109[5];
              auVar108[5] = (bVar38 < bVar10) * bVar10 | (bVar38 >= bVar10) * bVar38;
              bVar11 = auVar109[6];
              auVar108[6] = (bVar39 < bVar11) * bVar11 | (bVar39 >= bVar11) * bVar39;
              bVar12 = auVar109[7];
              auVar108[7] = (bVar40 < bVar12) * bVar12 | (bVar40 >= bVar12) * bVar40;
              bVar13 = auVar109[8];
              auVar108[8] = (bVar41 < bVar13) * bVar13 | (bVar41 >= bVar13) * bVar41;
              bVar14 = auVar109[9];
              auVar108[9] = (bVar42 < bVar14) * bVar14 | (bVar42 >= bVar14) * bVar42;
              bVar15 = auVar109[10];
              auVar108[10] = (bVar43 < bVar15) * bVar15 | (bVar43 >= bVar15) * bVar43;
              bVar16 = auVar109[0xb];
              auVar108[0xb] = (bVar44 < bVar16) * bVar16 | (bVar44 >= bVar16) * bVar44;
              bVar17 = auVar109[0xc];
              auVar108[0xc] = (bVar45 < bVar17) * bVar17 | (bVar45 >= bVar17) * bVar45;
              bVar18 = auVar109[0xd];
              auVar108[0xd] = (bVar46 < bVar18) * bVar18 | (bVar46 >= bVar18) * bVar46;
              bVar19 = auVar109[0xe];
              auVar108[0xe] = (bVar47 < bVar19) * bVar19 | (bVar47 >= bVar19) * bVar47;
              bVar20 = auVar109[0xf];
              auVar108[0xf] = (bVar48 < bVar20) * bVar20 | (bVar48 >= bVar20) * bVar48;
              auVar94[0] = (bVar5 < bVar33) * bVar5 | (bVar5 >= bVar33) * bVar33;
              auVar94[1] = (bVar6 < bVar34) * bVar6 | (bVar6 >= bVar34) * bVar34;
              auVar94[2] = (bVar7 < bVar35) * bVar7 | (bVar7 >= bVar35) * bVar35;
              auVar94[3] = (bVar8 < bVar36) * bVar8 | (bVar8 >= bVar36) * bVar36;
              auVar94[4] = (bVar9 < bVar37) * bVar9 | (bVar9 >= bVar37) * bVar37;
              auVar94[5] = (bVar10 < bVar38) * bVar10 | (bVar10 >= bVar38) * bVar38;
              auVar94[6] = (bVar11 < bVar39) * bVar11 | (bVar11 >= bVar39) * bVar39;
              auVar94[7] = (bVar12 < bVar40) * bVar12 | (bVar12 >= bVar40) * bVar40;
              auVar94[8] = (bVar13 < bVar41) * bVar13 | (bVar13 >= bVar41) * bVar41;
              auVar94[9] = (bVar14 < bVar42) * bVar14 | (bVar14 >= bVar42) * bVar42;
              auVar94[10] = (bVar15 < bVar43) * bVar15 | (bVar15 >= bVar43) * bVar43;
              auVar94[0xb] = (bVar16 < bVar44) * bVar16 | (bVar16 >= bVar44) * bVar44;
              auVar94[0xc] = (bVar17 < bVar45) * bVar17 | (bVar17 >= bVar45) * bVar45;
              auVar94[0xd] = (bVar18 < bVar46) * bVar18 | (bVar18 >= bVar46) * bVar46;
              auVar94[0xe] = (bVar19 < bVar47) * bVar19 | (bVar19 >= bVar47) * bVar47;
              auVar94[0xf] = (bVar20 < bVar48) * bVar20 | (bVar20 >= bVar48) * bVar48;
              auVar109 = psubusb(auVar108,auVar94);
              auVar22[0xd] = 0;
              auVar22._0_13_ = auVar109._0_13_;
              auVar22[0xe] = auVar109[7];
              auVar25[0xc] = auVar109[6];
              auVar25._0_12_ = auVar109._0_12_;
              auVar25._13_2_ = auVar22._13_2_;
              auVar27[0xb] = 0;
              auVar27._0_11_ = auVar109._0_11_;
              auVar27._12_3_ = auVar25._12_3_;
              auVar29[10] = auVar109[5];
              auVar29._0_10_ = auVar109._0_10_;
              auVar29._11_4_ = auVar27._11_4_;
              auVar30[9] = 0;
              auVar30._0_9_ = auVar109._0_9_;
              auVar30._10_5_ = auVar29._10_5_;
              auVar31[8] = auVar109[4];
              auVar31._0_8_ = auVar109._0_8_;
              auVar31._9_6_ = auVar30._9_6_;
              auVar51._7_8_ = 0;
              auVar51._0_7_ = auVar31._8_7_;
              Var52 = CONCAT81(SUB158(auVar51 << 0x40,7),auVar109[3]);
              auVar59._9_6_ = 0;
              auVar59._0_9_ = Var52;
              auVar53._1_10_ = SUB1510(auVar59 << 0x30,5);
              auVar53[0] = auVar109[2];
              auVar60._11_4_ = 0;
              auVar60._0_11_ = auVar53;
              auVar54._1_12_ = SUB1512(auVar60 << 0x20,3);
              auVar54[0] = auVar109[1];
              auVar95._0_2_ = (ushort)auVar109[0] * (ushort)auVar109[0];
              auVar95._2_2_ = auVar54._0_2_ * auVar54._0_2_;
              auVar95._4_2_ = auVar53._0_2_ * auVar53._0_2_;
              sVar97 = (short)Var52;
              auVar95._6_2_ = sVar97 * sVar97;
              auVar95._8_2_ = auVar31._8_2_ * auVar31._8_2_;
              auVar95._10_2_ = auVar29._10_2_ * auVar29._10_2_;
              uVar32 = auVar22._13_2_ >> 8;
              auVar95._12_2_ = auVar25._12_2_ * auVar25._12_2_;
              auVar95._14_2_ = uVar32 * uVar32;
              auVar110._0_2_ = (ushort)auVar109[8] * (ushort)auVar109[8];
              auVar110._2_2_ = (ushort)auVar109[9] * (ushort)auVar109[9];
              auVar110._4_2_ = (ushort)auVar109[10] * (ushort)auVar109[10];
              auVar110._6_2_ = (ushort)auVar109[0xb] * (ushort)auVar109[0xb];
              auVar110._8_2_ = (ushort)auVar109[0xc] * (ushort)auVar109[0xc];
              auVar110._10_2_ = (ushort)auVar109[0xd] * (ushort)auVar109[0xd];
              auVar110._12_2_ = (ushort)auVar109[0xe] * (ushort)auVar109[0xe];
              auVar110._14_2_ = (ushort)auVar109[0xf] * (ushort)auVar109[0xf];
              *(undefined1 (*) [16])(puVar72 + uVar76 + 2) = auVar95;
              *(undefined1 (*) [16])(puVar72 + uVar76 + 10) = auVar110;
              uVar76 = uVar76 + 0x10;
            } while (uVar76 < uVar65);
            puVar72[0] = 0;
            puVar72[1] = 0;
          }
          (puVar72 + uVar65 + 2)[0] = 0;
          (puVar72 + uVar65 + 2)[1] = 0;
          puVar70 = puVar70 + uVar90;
          puVar69 = puVar69 + uVar65;
          puVar72 = puVar72 + 0x24;
          uVar68 = uVar68 + 1;
        } while (uVar68 != uVar61);
      }
      if (uVar62 != 0) {
        puVar73 = local_1038;
        uVar76 = 0;
        do {
          pauVar75 = (undefined1 (*) [16])(local_2938 + uVar76);
          lVar77 = 0x50;
          do {
            auVar109 = *pauVar75;
            auVar23._10_2_ = 0;
            auVar23._0_10_ = auVar109._0_10_;
            auVar23._12_2_ = auVar109._6_2_;
            auVar26._8_2_ = auVar109._4_2_;
            auVar26._0_8_ = auVar109._0_8_;
            auVar26._10_4_ = auVar23._10_4_;
            auVar55._6_8_ = 0;
            auVar55._0_6_ = auVar26._8_6_;
            auVar102._6_8_ = SUB148(auVar55 << 0x40,6);
            auVar102._4_2_ = auVar109._2_2_;
            auVar102._0_2_ = auVar109._0_2_;
            auVar102._2_2_ = 0;
            auVar102._14_2_ = 0;
            if (uVar76 == 0) {
              auVar102._8_4_ = auVar26._8_4_;
              auVar102._4_4_ = auVar102._8_4_;
              auVar102._0_4_ = auVar102._8_4_;
              auVar102._12_4_ = auVar23._10_4_ >> 0x10;
            }
            auVar93._0_4_ = CONCAT22(0,auVar109._8_2_);
            uVar98 = auVar109._10_2_;
            auVar93._4_2_ = uVar98;
            auVar93._6_2_ = 0;
            auVar93._8_2_ = auVar109._12_2_;
            auVar93._10_2_ = 0;
            auVar93._12_2_ = auVar109._14_2_;
            *(undefined1 (*) [16])((long)local_2a28 + lVar77) = auVar102;
            if ((long)(int)(uVar62 - 4) <= (long)uVar76) {
              auVar93._6_2_ = 0;
              auVar93._8_2_ = uVar98;
              auVar93._10_2_ = 0;
              auVar93._12_2_ = uVar98;
            }
            auVar96._14_2_ = 0;
            auVar96._0_14_ = auVar93;
            *(undefined1 (*) [16])((long)&local_2a18 + lVar77) = auVar96;
            pauVar75 = (undefined1 (*) [16])(pauVar75[4] + 8);
            lVar77 = lVar77 + 0x20;
          } while (lVar77 != 0xb0);
          local_2a18 = local_29f8[4];
          uStack_2a10 = local_29f8[5];
          local_2a08 = local_29f8[6];
          uStack_2a00 = local_29f8[7];
          local_29f8[0] = local_29f8[4];
          local_29f8[1] = local_29f8[5];
          local_29f8[2] = local_29f8[6];
          local_29f8[3] = local_29f8[7];
          if (uVar61 != 0) {
            uVar85 = 0;
            puVar78 = puVar73;
            do {
              uVar90 = 0;
              uVar68 = 0;
              uVar63 = 0;
              uVar80 = 0;
              lVar77 = 0x10;
              uVar99 = 0;
              uVar103 = 0;
              uVar104 = 0;
              uVar106 = 0;
              do {
                uVar90 = uVar90 + *(int *)((long)local_2a28 + lVar77);
                uVar68 = uVar68 + *(int *)((long)local_2a28 + lVar77 + 4);
                uVar63 = uVar63 + *(int *)((long)local_2a28 + lVar77 + 8);
                uVar80 = uVar80 + *(int *)((long)local_2a28 + lVar77 + 0xc);
                uVar99 = uVar99 + *(int *)((long)&local_2a18 + lVar77);
                uVar103 = uVar103 + *(int *)((long)&local_2a18 + lVar77 + 4);
                uVar104 = uVar104 + *(int *)((long)&uStack_2a10 + lVar77);
                uVar106 = uVar106 + *(int *)((long)&uStack_2a10 + lVar77 + 4);
                lVar77 = lVar77 + 0x20;
              } while (lVar77 != 0xb0);
              lVar77 = 0;
              do {
                uVar2 = *(undefined8 *)((long)local_29f8 + lVar77 + 8);
                uVar49 = *(undefined8 *)((long)local_29f8 + lVar77 + 0x10);
                uVar50 = *(undefined8 *)((long)local_29f8 + lVar77 + 0x18);
                *(undefined8 *)((long)&local_2a18 + lVar77) =
                     *(undefined8 *)((long)local_29f8 + lVar77);
                *(undefined8 *)((long)&uStack_2a10 + lVar77) = uVar2;
                *(undefined8 *)((long)&local_2a08 + lVar77) = uVar49;
                *(undefined8 *)((long)&uStack_2a00 + lVar77) = uVar50;
                lVar77 = lVar77 + 0x20;
              } while (lVar77 != 0x80);
              local_2988 = local_29a8;
              local_2998 = local_29b8;
              if ((long)uVar85 <= (long)(int)(uVar61 - 4)) {
                auVar109 = *pauVar75;
                auVar21._10_2_ = 0;
                auVar21._0_10_ = auVar109._0_10_;
                auVar21._12_2_ = auVar109._6_2_;
                auVar24._8_2_ = auVar109._4_2_;
                auVar24._0_8_ = auVar109._0_8_;
                auVar24._10_4_ = auVar21._10_4_;
                auVar56._6_8_ = 0;
                auVar56._0_6_ = auVar24._8_6_;
                auVar28._4_2_ = auVar109._2_2_;
                auVar28._0_4_ = auVar109._0_4_;
                auVar28._6_8_ = SUB148(auVar56 << 0x40,6);
                local_2998._0_4_ = auVar109._0_4_ & 0xffff;
                local_2998._4_10_ = auVar28._4_10_;
                local_2998._14_2_ = 0;
                if (uVar76 == 0) {
                  local_2998._8_4_ = auVar24._8_4_;
                  local_2998._4_4_ = local_2998._8_4_;
                  local_2998._0_4_ = local_2998._8_4_;
                  local_2998._12_4_ = auVar21._10_4_ >> 0x10;
                }
                auVar107._0_4_ = CONCAT22(0,auVar109._8_2_);
                uVar98 = auVar109._10_2_;
                auVar107._4_2_ = uVar98;
                auVar107._6_2_ = 0;
                auVar107._8_2_ = auVar109._12_2_;
                auVar107._10_2_ = 0;
                auVar107._12_2_ = auVar109._14_2_;
                if ((long)(int)(uVar62 - 4) <= (long)uVar76) {
                  auVar107._6_2_ = 0;
                  auVar107._8_2_ = uVar98;
                  auVar107._10_2_ = 0;
                  auVar107._12_2_ = uVar98;
                }
                local_2988._14_2_ = 0;
                local_2988._0_14_ = auVar107;
                pauVar75 = (undefined1 (*) [16])(pauVar75[4] + 8);
              }
              lVar77 = 0;
              do {
                *(uint32_t *)(puVar78 + lVar77) =
                     (sse_bytemask_2x4[0][1][lVar77 * 2 + 3] & uVar106) +
                     (sse_bytemask_2x4[0][0][lVar77 * 2 + 3] & uVar80) +
                     (sse_bytemask_2x4[0][1][lVar77 * 2 + 1] & uVar103) +
                     (sse_bytemask_2x4[0][0][lVar77 * 2 + 1] & uVar68) +
                     (sse_bytemask_2x4[0][1][lVar77 * 2 + 2] & uVar104) +
                     (sse_bytemask_2x4[0][0][lVar77 * 2 + 2] & uVar63) +
                     (sse_bytemask_2x4[0][1][lVar77 * 2] & uVar99) +
                     (sse_bytemask_2x4[0][0][lVar77 * 2] & uVar90);
                lVar77 = lVar77 + 4;
              } while (lVar77 != 0x10);
              uVar85 = uVar85 + 1;
              puVar78 = puVar78 + 0x80;
            } while (uVar85 != uVar64);
          }
          uVar76 = uVar76 + 4;
          puVar73 = puVar73 + 0x10;
        } while (uVar76 < uVar65);
      }
      dVar112 = 1.0 / ((dVar112 + 0.5) * local_2aa8 *
                      (double)(~-(ulong)(dVar87 < 1e-05) & (ulong)dVar91 |
                              -(ulong)(dVar87 < 1e-05) & 0x3ee4f8b588e368f1));
      lVar77 = 0;
      do {
        uVar2 = *(undefined8 *)(subblock_mses + lVar77);
        adStack_2958[lVar77] = (double)(int)uVar2 * 0.008333333333333333;
        adStack_2958[lVar77 + 1] = (double)(int)((ulong)uVar2 >> 0x20) * 0.008333333333333333;
        auVar89._0_8_ = local_2a38[lVar77] * dVar112;
        auVar89._8_8_ = local_2a38[lVar77 + 1] * dVar112;
        *(undefined1 (*) [16])(adStack_2978 + lVar77) = auVar89;
        lVar77 = lVar77 + 2;
      } while (lVar77 != 4);
      if (tf_wgt_calc_lvl == 0) {
        if (uVar61 != 0) {
          uVar76 = 0;
          puVar73 = local_1038;
          piVar74 = local_2038;
          iVar81 = 0;
          auVar109 = _DAT_00502510;
          do {
            if (uVar62 != 0) {
              uVar85 = 0;
              do {
                bVar5 = puVar82[uVar85];
                uVar86 = (ulong)(((uint)(bVar58 >> 1 <= uVar85) | (uint)(bVar57 >> 1 <= uVar76) * 2)
                                << 3);
                dVar112 = ((double)(uint)(piVar74[uVar85] + *(int *)(puVar73 + uVar85 * 4)) * dVar92
                           * 0.041666666666666664 + *(double *)((long)adStack_2958 + uVar86)) *
                          *(double *)((long)adStack_2978 + uVar86);
                uVar86 = -(ulong)(dVar112 < 7.0);
                dVar112 = exp((double)(~uVar86 & 0xc01c000000000000 |
                                      ((ulong)dVar112 ^ auVar109._0_8_) & uVar86));
                auVar109 = _DAT_00502510;
                count[lVar84 + (long)iVar81 + uVar85] =
                     count[lVar84 + (long)iVar81 + uVar85] + (short)(int)(dVar112 * 1000.0);
                accum[lVar84 + (long)iVar81 + uVar85] =
                     accum[lVar84 + (long)iVar81 + uVar85] + (uint)bVar5 * (int)(dVar112 * 1000.0);
                uVar85 = uVar85 + 1;
              } while (uVar65 != uVar85);
              iVar81 = iVar81 + (int)uVar85;
            }
            uVar76 = uVar76 + 1;
            piVar74 = piVar74 + 0x20;
            puVar73 = puVar73 + 0x80;
            puVar82 = puVar82 + uVar65;
          } while (uVar76 != uVar64);
        }
      }
      else if (uVar61 != 0) {
        uVar76 = 0;
        puVar73 = local_1038;
        piVar74 = local_2038;
        iVar81 = 0;
        do {
          if (uVar62 != 0) {
            uVar85 = 0;
            do {
              uVar86 = (ulong)(((uint)(bVar58 >> 1 <= uVar85) | (uint)(bVar57 >> 1 <= uVar76) * 2)
                              << 3);
              dVar112 = ((double)(uint)(piVar74[uVar85] + *(int *)(puVar73 + uVar85 * 4)) * dVar92 *
                         0.041666666666666664 + *(double *)((long)adStack_2958 + uVar86)) *
                        *(double *)((long)adStack_2978 + uVar86);
              if (7.0 <= dVar112) {
                dVar112 = 7.0;
              }
              iVar67 = (int)((float)((int)((float)dVar112 * -12102203.0) + 0x3f7f127f) * 1000.0 +
                            0.5);
              bVar5 = puVar82[uVar85];
              count[lVar84 + (long)iVar81 + uVar85] =
                   count[lVar84 + (long)iVar81 + uVar85] + (short)iVar67;
              accum[lVar84 + (long)iVar81 + uVar85] =
                   accum[lVar84 + (long)iVar81 + uVar85] + (uint)bVar5 * iVar67;
              uVar85 = uVar85 + 1;
            } while (uVar65 != uVar85);
            iVar81 = iVar81 + (int)uVar85;
          }
          uVar76 = uVar76 + 1;
          piVar74 = piVar74 + 0x20;
          puVar73 = puVar73 + 0x80;
          puVar82 = puVar82 + uVar65;
        } while (uVar76 != uVar64);
      }
      local_2afc = local_2afc + uVar62 * uVar61;
      uVar66 = uVar66 + 1;
    } while (uVar66 != (uint)num_planes);
  }
  return;
}

Assistant:

void av1_apply_temporal_filter_sse2(
    const YV12_BUFFER_CONFIG *frame_to_filter, const MACROBLOCKD *mbd,
    const BLOCK_SIZE block_size, const int mb_row, const int mb_col,
    const int num_planes, const double *noise_levels, const MV *subblock_mvs,
    const int *subblock_mses, const int q_factor, const int filter_strength,
    int tf_wgt_calc_lvl, const uint8_t *pred, uint32_t *accum,
    uint16_t *count) {
  const int is_high_bitdepth = frame_to_filter->flags & YV12_FLAG_HIGHBITDEPTH;
  assert(block_size == BLOCK_32X32 && "Only support 32x32 block with sse2!");
  assert(TF_WINDOW_LENGTH == 5 && "Only support window length 5 with sse2!");
  assert(!is_high_bitdepth && "Only support low bit-depth with sse2!");
  assert(num_planes >= 1 && num_planes <= MAX_MB_PLANE);
  (void)is_high_bitdepth;

  const int mb_height = block_size_high[block_size];
  const int mb_width = block_size_wide[block_size];
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int min_frame_size = AOMMIN(frame_height, frame_width);
  // Variables to simplify combined error calculation.
  const double inv_factor = 1.0 / ((TF_WINDOW_BLOCK_BALANCE_WEIGHT + 1) *
                                   TF_SEARCH_ERROR_NORM_WEIGHT);
  const double weight_factor =
      (double)TF_WINDOW_BLOCK_BALANCE_WEIGHT * inv_factor;
  // Adjust filtering based on q.
  // Larger q -> stronger filtering -> larger weight.
  // Smaller q -> weaker filtering -> smaller weight.
  double q_decay = pow((double)q_factor / TF_Q_DECAY_THRESHOLD, 2);
  q_decay = CLIP(q_decay, 1e-5, 1);
  if (q_factor >= TF_QINDEX_CUTOFF) {
    // Max q_factor is 255, therefore the upper bound of q_decay is 8.
    // We do not need a clip here.
    q_decay = 0.5 * pow((double)q_factor / 64, 2);
  }
  // Smaller strength -> smaller filtering weight.
  double s_decay = pow((double)filter_strength / TF_STRENGTH_THRESHOLD, 2);
  s_decay = CLIP(s_decay, 1e-5, 1);
  double d_factor[4] = { 0 };
  uint16_t frame_sse[SSE_STRIDE * BH] = { 0 };
  uint32_t luma_sse_sum[BW * BH] = { 0 };

  for (int subblock_idx = 0; subblock_idx < 4; subblock_idx++) {
    // Larger motion vector -> smaller filtering weight.
    const MV mv = subblock_mvs[subblock_idx];
    const double distance = sqrt(pow(mv.row, 2) + pow(mv.col, 2));
    double distance_threshold = min_frame_size * TF_SEARCH_DISTANCE_THRESHOLD;
    distance_threshold = AOMMAX(distance_threshold, 1);
    d_factor[subblock_idx] = distance / distance_threshold;
    d_factor[subblock_idx] = AOMMAX(d_factor[subblock_idx], 1);
  }

  // Handle planes in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const uint32_t plane_h = mb_height >> mbd->plane[plane].subsampling_y;
    const uint32_t plane_w = mb_width >> mbd->plane[plane].subsampling_x;
    const uint32_t frame_stride = frame_to_filter->strides[plane == 0 ? 0 : 1];
    const int frame_offset = mb_row * plane_h * frame_stride + mb_col * plane_w;

    const uint8_t *ref = frame_to_filter->buffers[plane] + frame_offset;
    const int ss_x_shift =
        mbd->plane[plane].subsampling_x - mbd->plane[AOM_PLANE_Y].subsampling_x;
    const int ss_y_shift =
        mbd->plane[plane].subsampling_y - mbd->plane[AOM_PLANE_Y].subsampling_y;
    const int num_ref_pixels = TF_WINDOW_LENGTH * TF_WINDOW_LENGTH +
                               ((plane) ? (1 << (ss_x_shift + ss_y_shift)) : 0);
    const double inv_num_ref_pixels = 1.0 / num_ref_pixels;
    // Larger noise -> larger filtering weight.
    const double n_decay = 0.5 + log(2 * noise_levels[plane] + 5.0);
    // Decay factors for non-local mean approach.
    const double decay_factor = 1 / (n_decay * q_decay * s_decay);

    // Filter U-plane and V-plane using Y-plane. This is because motion
    // search is only done on Y-plane, so the information from Y-plane
    // will be more accurate. The luma sse sum is reused in both chroma
    // planes.
    if (plane == AOM_PLANE_U) {
      for (unsigned int i = 0, k = 0; i < plane_h; i++) {
        for (unsigned int j = 0; j < plane_w; j++, k++) {
          for (int ii = 0; ii < (1 << ss_y_shift); ++ii) {
            for (int jj = 0; jj < (1 << ss_x_shift); ++jj) {
              const int yy = (i << ss_y_shift) + ii;  // Y-coord on Y-plane.
              const int xx = (j << ss_x_shift) + jj;  // X-coord on Y-plane.
              luma_sse_sum[i * BW + j] += frame_sse[yy * SSE_STRIDE + xx + 2];
            }
          }
        }
      }
    }

    apply_temporal_filter(ref, frame_stride, pred + plane_offset, plane_w,
                          plane_w, plane_h, subblock_mses, accum + plane_offset,
                          count + plane_offset, frame_sse, luma_sse_sum,
                          inv_num_ref_pixels, decay_factor, inv_factor,
                          weight_factor, d_factor, tf_wgt_calc_lvl);
    plane_offset += plane_h * plane_w;
  }
}